

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.h
# Opt level: O2

void wasm::debuginfo::copyOriginalToReplacement
               (Expression *original,Expression *replacement,Function *func)

{
  undefined8 uVar1;
  size_type sVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
  *this;
  Expression *local_28;
  Expression *original_local;
  Expression *replacement_local;
  
  if ((func->debugLocations)._M_h._M_element_count != 0) {
    this = &func->debugLocations;
    local_28 = original;
    original_local = replacement;
    sVar2 = std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&this->_M_h,&original_local);
    if (sVar2 == 0) {
      iVar3 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this->_M_h,&local_28);
      if (iVar3.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        pmVar4 = std::__detail::
                 _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this,&original_local);
        uVar1 = *(undefined8 *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                        ._M_cur + 0x18);
        *(undefined8 *)
         &(pmVar4->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
             *(undefined8 *)
              ((long)iVar3.
                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                     ._M_cur + 0x10);
        *(undefined8 *)
         ((long)&(pmVar4->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload +
         8) = uVar1;
        *(undefined8 *)
         ((long)&(pmVar4->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                 _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload
         + 4) = *(undefined8 *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                        ._M_cur + 0x20);
      }
    }
  }
  return;
}

Assistant:

inline void copyOriginalToReplacement(Expression* original,
                                      Expression* replacement,
                                      Function* func) {
  auto& debugLocations = func->debugLocations;
  // Early exit if there is no debug info at all. Also, leave if we already
  // have debug info on the new replacement, which we don't want to trample:
  // if there is no debug info we do want to copy, as a replacement operation
  // suggests the new code plays the same role (it is an optimized version of
  // the old), but if the code is already annotated, trust that.
  if (debugLocations.empty() || debugLocations.count(replacement)) {
    return;
  }

  auto iter = debugLocations.find(original);
  if (iter != debugLocations.end()) {
    debugLocations[replacement] = iter->second;
    // Note that we do *not* erase the debug info of the expression being
    // replaced, because it may still exist: we might replace
    //
    //  (call
    //    (block ..
    //
    // with
    //
    //  (block
    //    (call ..
    //
    // We still want the call here to have its old debug info.
    //
    // (In most cases, of course, we do remove the replaced expression,
    // which means we accumulate unused garbage in debugLocations, but
    // that's not that bad; we use arena allocation for Expressions, after
    // all.)
  }
}